

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

int32_t icu_63::TimeZone::getRegion
                  (UnicodeString *id,char *region,int32_t capacity,UErrorCode *status)

{
  UChar *us;
  char *pcVar1;
  UBool UVar2;
  int8_t iVar3;
  int32_t length;
  ConstChar16Ptr local_48;
  UChar *local_40;
  UChar *uregion;
  UErrorCode *pUStack_30;
  int32_t resultLen;
  UErrorCode *status_local;
  char *pcStack_20;
  int32_t capacity_local;
  char *region_local;
  UnicodeString *id_local;
  
  uregion._4_4_ = 0;
  *region = '\0';
  pUStack_30 = status;
  status_local._4_4_ = capacity;
  pcStack_20 = region;
  region_local = (char *)id;
  UVar2 = ::U_FAILURE(*status);
  pcVar1 = region_local;
  if (UVar2 == '\0') {
    local_40 = (UChar *)0x0;
    ConstChar16Ptr::ConstChar16Ptr(&local_48,L"Etc/Unknown");
    iVar3 = UnicodeString::compare((UnicodeString *)pcVar1,&local_48,0xb);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    if (iVar3 != '\0') {
      local_40 = getRegion((UnicodeString *)region_local);
    }
    if (local_40 == (UChar *)0x0) {
      *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
      id_local._4_4_ = 0;
    }
    else {
      uregion._4_4_ = u_strlen_63(local_40);
      pcVar1 = pcStack_20;
      us = local_40;
      length = uprv_min_63(uregion._4_4_,status_local._4_4_);
      u_UCharsToChars_63(us,pcVar1,length);
      if (status_local._4_4_ < uregion._4_4_) {
        *pUStack_30 = U_BUFFER_OVERFLOW_ERROR;
        id_local._4_4_ = uregion._4_4_;
      }
      else {
        id_local._4_4_ = u_terminateChars_63(pcStack_20,status_local._4_4_,uregion._4_4_,pUStack_30)
        ;
      }
    }
  }
  else {
    id_local._4_4_ = 0;
  }
  return id_local._4_4_;
}

Assistant:

int32_t
TimeZone::getRegion(const UnicodeString& id, char *region, int32_t capacity, UErrorCode& status)
{
    int32_t resultLen = 0;
    *region = 0;
    if (U_FAILURE(status)) {
        return 0;
    }

    const UChar *uregion = NULL;
    // "Etc/Unknown" is not a system zone ID,
    // but in the zone data
    if (id.compare(UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH) != 0) {
        uregion = getRegion(id);
    }
    if (uregion == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    resultLen = u_strlen(uregion);
    // A region code is represented by invariant characters
    u_UCharsToChars(uregion, region, uprv_min(resultLen, capacity));

    if (capacity < resultLen) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return resultLen;
    }

    return u_terminateChars(region, capacity, resultLen, &status);
}